

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

double __thiscall
imrt::ApertureILS::closeBeamlet
          (ApertureILS *this,int beamlet,int side,int aperture,Station *station,double c_eval,
          Plan *P)

{
  double dVar1;
  double local_70;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_68;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double local_38;
  
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&diff;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node._M_size = 0;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  dVar1 = Station::getApertureIntensity(station,aperture);
  dVar1 = Plan::get_delta_eval(P,station,beamlet,-dVar1,999999);
  local_70 = c_eval;
  if (c_eval < dVar1) {
    Station::clearHistory(station);
    goto LAB_0011f97f;
  }
  if (side == 2) {
    Station::closeBeamlet_abi_cxx11_
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_68,
               station,beamlet,aperture,false);
LAB_0011f7ca:
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_move_assign(&diff,&local_68);
    std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_clear(&local_68);
    if (diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size == 0) goto LAB_0011f97f;
  }
  else {
    if (side == 1) {
      Station::closeBeamlet_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_68
                 ,station,beamlet,aperture,true);
      goto LAB_0011f7ca;
    }
    Station::closeBeamlet_abi_cxx11_
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_68,
               station,beamlet,aperture,true);
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_move_assign(&diff,&local_68);
    std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_clear(&local_68);
    local_38 = c_eval;
    if (diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size != 0) {
      local_38 = Plan::incremental_eval(P,station,&diff);
      Station::undoLast_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_68
                 ,station);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_move_assign(&diff,&local_68);
      std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_clear(&local_68);
      Plan::incremental_eval(P,station,&diff);
    }
    Station::closeBeamlet_abi_cxx11_
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_68,
               station,beamlet,aperture,false);
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_move_assign(&diff,&local_68);
    std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_clear(&local_68);
    if (diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size != 0) {
      local_70 = Plan::incremental_eval(P,station,&diff);
      Station::undoLast_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_68
                 ,station);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_move_assign(&diff,&local_68);
      std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_clear(&local_68);
      Plan::incremental_eval(P,station,&diff);
    }
    if (local_70 <= local_38) {
      Station::closeBeamlet_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_68
                 ,station,beamlet,aperture,false);
    }
    else {
      Station::closeBeamlet_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_68
                 ,station,beamlet,aperture,true);
    }
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_move_assign(&diff,&local_68);
    std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_clear(&local_68);
  }
  local_70 = Plan::incremental_eval(P,station,&diff);
LAB_0011f97f:
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
  ;
  return local_70;
}

Assistant:

double ApertureILS::closeBeamlet(int beamlet, int side, int aperture, Station& station, double c_eval, Plan& P) {
  double aux_eval, l_eval, r_eval;
  list <pair<int, double> > diff;
  
  if (P.get_delta_eval(station, beamlet, -station.getApertureIntensity(aperture)) > c_eval){
    station.clearHistory();
    return(c_eval);
  }
  
  if (side == 1) {
    diff = station.closeBeamlet(beamlet, aperture, true);
    if (diff.size() > 0) {
      c_eval = P.incremental_eval(station, diff);
    } 
  } else if (side==2) {
    diff = station.closeBeamlet(beamlet, aperture, false);
    if (diff.size() > 0) {
      c_eval = P.incremental_eval(station, diff);
    }
  } else {
    l_eval = c_eval;
    diff = station.closeBeamlet(beamlet, aperture, true);
    if (diff.size() > 0) {
      l_eval = P.incremental_eval(station, diff);
      diff = station.undoLast();
      aux_eval = P.incremental_eval(station, diff);
    }
    r_eval = c_eval;
    diff = station.closeBeamlet(beamlet, aperture, false);
    if (diff.size() > 0) {
      r_eval = P.incremental_eval(station, diff);
      diff = station.undoLast();
      aux_eval = P.incremental_eval(station, diff);
    }
    
    if (r_eval > l_eval){
      diff = station.closeBeamlet(beamlet, aperture, true);
      c_eval = P.incremental_eval(station, diff);
    } else {
      diff = station.closeBeamlet(beamlet, aperture, false);
      c_eval = P.incremental_eval(station, diff);
    }
  }
  return(c_eval);
}